

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdf.h
# Opt level: O3

int hydro_kdf_derive_from_key
              (uint8_t *subkey,size_t subkey_len,uint64_t subkey_id,char *ctx,uint8_t *key)

{
  int iVar1;
  ulong uVar2;
  hydro_hash_state st;
  undefined1 local_a8 [4];
  undefined2 local_a4;
  undefined8 local_a2;
  undefined2 local_9a;
  undefined1 uStack_98;
  undefined5 uStack_97;
  undefined3 uStack_92;
  undefined5 uStack_8f;
  undefined3 uStack_8a;
  undefined5 uStack_87;
  undefined3 uStack_82;
  undefined5 uStack_7f;
  undefined3 uStack_7a;
  undefined5 uStack_77;
  undefined8 uStack_72;
  undefined8 uStack_6a;
  undefined8 uStack_62;
  undefined2 local_5a;
  hydro_hash_state local_58;
  
  local_a2 = *(undefined8 *)ctx;
  local_a8 = (undefined1  [4])0x616d7404;
  local_a4 = 0x863;
  local_5a = 0;
  local_9a = 0;
  uStack_97 = 0;
  uStack_92 = 0;
  uStack_8f = 0;
  uStack_8a = 0;
  uStack_87 = 0;
  uStack_82 = 0;
  uStack_7f = 0;
  uStack_7a = 0;
  uStack_77 = 0;
  uStack_72 = 0;
  uStack_6a = 0;
  uStack_62 = 0;
  if (key == (uint8_t *)0x0) {
    uVar2 = 0x20;
    uStack_98 = 0;
  }
  else {
    uVar2 = 0x40;
    uStack_98 = 0x20;
    uStack_97 = (undefined5)*(undefined8 *)key;
    uStack_92 = (undefined3)((ulong)*(undefined8 *)key >> 0x28);
    uStack_8f = (undefined5)*(undefined8 *)(key + 8);
    uStack_8a = (undefined3)((ulong)*(undefined8 *)(key + 8) >> 0x28);
    uStack_87 = (undefined5)*(undefined8 *)(key + 0x10);
    uStack_82 = (undefined3)((ulong)*(undefined8 *)(key + 0x10) >> 0x28);
    uStack_7f = (undefined5)*(undefined8 *)(key + 0x18);
    uStack_7a = (undefined3)((ulong)*(undefined8 *)(key + 0x18) >> 0x28);
  }
  local_a8[uVar2] = 8;
  *(uint64_t *)(local_a8 + uVar2 + 1) = subkey_id;
  local_58.state[0] = 0;
  local_58.state[1] = 0;
  local_58.state[2] = 0;
  local_58.state[3] = 0;
  local_58.state[4] = 0;
  local_58.state[5] = 0;
  local_58.state[6] = 0;
  local_58.state[7] = 0;
  local_58.state[8] = 0;
  local_58.state[9] = 0;
  local_58.state[10] = 0;
  local_58.state[0xb] = 0;
  local_58.buf_off = '\0';
  local_58.align[0] = '\0';
  local_58.align[1] = '\0';
  local_58.align[2] = '\0';
  hydro_hash_update(&local_58,local_a8,uVar2 | 0x10);
  iVar1 = hydro_hash_final(&local_58,subkey,subkey_len);
  return iVar1;
}

Assistant:

int
hydro_kdf_derive_from_key(uint8_t *subkey, size_t subkey_len, uint64_t subkey_id,
                          const char    ctx[hydro_kdf_CONTEXTBYTES],
                          const uint8_t key[hydro_kdf_KEYBYTES])
{
    hydro_hash_state st;

    COMPILER_ASSERT(hydro_kdf_CONTEXTBYTES >= hydro_hash_CONTEXTBYTES);
    COMPILER_ASSERT(hydro_kdf_KEYBYTES >= hydro_hash_KEYBYTES);
    if (hydro_hash_init_with_tweak(&st, ctx, subkey_id, key) != 0) {
        return -1;
    }
    return hydro_hash_final(&st, subkey, subkey_len);
}